

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

DWARFUnit * __thiscall
llvm::DWARFDebugLine::SectionParser::prepareToParse(SectionParser *this,uint64_t Offset)

{
  _Rb_tree_header *p_Var1;
  DWARFUnit *pDVar2;
  _Base_ptr p_Var3;
  uint8_t uVar4;
  _Base_ptr p_Var5;
  
  p_Var1 = &(this->LineToUnit)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < Offset]) {
    if (*(ulong *)(p_Var5 + 1) >= Offset) {
      p_Var3 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var5 = p_Var3, Offset < *(ulong *)(p_Var3 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    pDVar2 = (DWARFUnit *)0x0;
  }
  else {
    pDVar2 = (DWARFUnit *)p_Var5[1]._M_parent;
  }
  if (pDVar2 == (DWARFUnit *)0x0) {
    uVar4 = '\0';
  }
  else {
    uVar4 = (pDVar2->Header).FormParams.AddrSize;
  }
  (this->DebugLineData->super_DataExtractor).AddressSize = uVar4;
  return pDVar2;
}

Assistant:

DWARFUnit *DWARFDebugLine::SectionParser::prepareToParse(uint64_t Offset) {
  DWARFUnit *U = nullptr;
  auto It = LineToUnit.find(Offset);
  if (It != LineToUnit.end())
    U = It->second;
  DebugLineData.setAddressSize(U ? U->getAddressByteSize() : 0);
  return U;
}